

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

void __thiscall
CASC_FILE_TREE::SetExtras
          (CASC_FILE_TREE *this,PCASC_FILE_NODE pFileNode,DWORD FileSize,DWORD LocaleId)

{
  DWORD LocaleId_local;
  DWORD FileSize_local;
  PCASC_FILE_NODE pFileNode_local;
  CASC_FILE_TREE *this_local;
  
  if (this->FileSizeOffset != 0) {
    SET_NODE_INT32(pFileNode,this->FileSizeOffset,FileSize);
  }
  if (this->LocaleIdOffset != 0) {
    SET_NODE_INT32(pFileNode,this->LocaleIdOffset,LocaleId);
  }
  return;
}

Assistant:

void CASC_FILE_TREE::SetExtras(PCASC_FILE_NODE pFileNode, DWORD FileSize, DWORD LocaleId)
{
    // Set the file size, if supported
    if(FileSizeOffset != 0)
    {
        SET_NODE_INT32(pFileNode, FileSizeOffset, FileSize);
    }

    // Set the locale ID, if supported
    if(LocaleIdOffset != 0)
    {
        SET_NODE_INT32(pFileNode, LocaleIdOffset, LocaleId);
    }
}